

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractLoggingDevice.cpp
# Opt level: O3

void __thiscall
SLogLib::AbstractLoggingDevicePriv::~AbstractLoggingDevicePriv(AbstractLoggingDevicePriv *this)

{
  pointer pcVar1;
  
  if (this->mFormatter != (AbstractFormatter *)0x0) {
    (**(code **)(*(long *)this->mFormatter + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->mBufferedMessages);
  pcVar1 = (this->mName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mName).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~AbstractLoggingDevicePriv()
	{
		delete mFormatter;
	}